

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

XrResult ApiLayerManifestFile::FindManifestFiles
                   (string *openxr_command,ManifestFileType type,
                   vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   *manifest_files)

{
  pointer pbVar1;
  __uid_t _Var2;
  __uid_t _Var3;
  __gid_t _Var4;
  __gid_t _Var5;
  ulong uVar6;
  string *output_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *manifest_files_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *manifest_files_01;
  XrResult XVar7;
  string *cur_file;
  pointer filename;
  char cVar8;
  ulong uVar9;
  allocator local_1b1;
  string xdg_conf_dirs;
  string relative_home_path;
  string relative_path;
  string search_path;
  string xdg_data_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string override_path;
  char home_additional [14];
  string override_env_var;
  string home;
  string xdg_data_home;
  string registry_location;
  
  relative_path._M_dataplus._M_p = (pointer)&relative_path.field_2;
  relative_path._M_string_length = 0;
  override_env_var._M_dataplus._M_p = (pointer)&override_env_var.field_2;
  override_env_var._M_string_length = 0;
  relative_path.field_2._M_local_buf[0] = '\0';
  override_env_var.field_2._M_local_buf[0] = '\0';
  registry_location._M_dataplus._M_p = (pointer)&registry_location.field_2;
  registry_location._M_string_length = 0;
  registry_location.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&relative_path);
  std::__cxx11::to_string(&xdg_conf_dirs,1);
  std::__cxx11::string::append((string *)&relative_path);
  std::__cxx11::string::~string((string *)&xdg_conf_dirs);
  if (type == MANIFEST_TYPE_IMPLICIT_API_LAYER) {
    std::__cxx11::string::append((char *)&relative_path);
  }
  else {
    if (type != MANIFEST_TYPE_EXPLICIT_API_LAYER) {
      std::__cxx11::string::string
                ((string *)&xdg_conf_dirs,
                 "ApiLayerManifestFile::FindManifestFiles - unknown manifest file requested",
                 (allocator *)&override_path);
      xdg_data_dirs._M_dataplus._M_p = (pointer)0x0;
      xdg_data_dirs._M_string_length = 0;
      xdg_data_dirs.field_2._M_allocated_capacity = 0;
      LoaderLogger::LogErrorMessage
                (openxr_command,&xdg_conf_dirs,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&xdg_data_dirs);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&xdg_data_dirs);
      std::__cxx11::string::~string((string *)&xdg_conf_dirs);
      XVar7 = XR_ERROR_FILE_ACCESS_ERROR;
      goto LAB_0011443a;
    }
    std::__cxx11::string::append((char *)&relative_path);
  }
  std::__cxx11::string::assign((char *)&override_env_var);
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  override_path._M_dataplus._M_p = (pointer)&override_path.field_2;
  override_path._M_string_length = 0;
  output_path = (string *)0x0;
  override_path.field_2._M_local_buf[0] = '\0';
  search_path._M_dataplus._M_p = (pointer)&search_path.field_2;
  search_path._M_string_length = 0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  search_path.field_2._M_local_buf[0] = '\0';
  if (override_env_var._M_string_length != 0) {
    _Var2 = geteuid();
    _Var3 = getuid();
    if (_Var2 == _Var3) {
      _Var4 = getegid();
      _Var5 = getgid();
      if (_Var4 == _Var5) {
        PlatformUtilsGetSecureEnv_abi_cxx11_(&xdg_conf_dirs,override_env_var._M_dataplus._M_p);
        std::__cxx11::string::operator=((string *)&override_path,(string *)&xdg_conf_dirs);
        std::__cxx11::string::~string((string *)&xdg_conf_dirs);
      }
    }
  }
  if (override_path._M_string_length == 0) {
    builtin_strncpy(home_additional + 8,"hare/",6);
    builtin_strncpy(home_additional,".local/s",8);
    PlatformUtilsGetSecureEnv_abi_cxx11_(&xdg_conf_dirs,"XDG_CONFIG_DIRS");
    PlatformUtilsGetSecureEnv_abi_cxx11_(&xdg_data_dirs,"XDG_DATA_DIRS");
    PlatformUtilsGetSecureEnv_abi_cxx11_(&xdg_data_home,"XDG_DATA_HOME");
    PlatformUtilsGetSecureEnv_abi_cxx11_(&home,"HOME");
    if (xdg_conf_dirs._M_string_length == 0) {
      std::__cxx11::string::string((string *)&relative_home_path,"/etc/xdg",&local_1b1);
      CopyIncludedPaths(SUB81(&relative_home_path,0),&relative_path,&search_path,output_path);
      std::__cxx11::string::~string((string *)&relative_home_path);
    }
    else {
      CopyIncludedPaths(SUB81(&xdg_conf_dirs,0),&relative_path,&search_path,output_path);
    }
    std::__cxx11::string::string((string *)&relative_home_path,"/usr/local/etc",&local_1b1);
    CopyIncludedPaths(SUB81(&relative_home_path,0),&relative_path,&search_path,output_path);
    std::__cxx11::string::~string((string *)&relative_home_path);
    std::__cxx11::string::string((string *)&relative_home_path,"/etc",&local_1b1);
    CopyIncludedPaths(SUB81(&relative_home_path,0),&relative_path,&search_path,output_path);
    std::__cxx11::string::~string((string *)&relative_home_path);
    if (xdg_data_dirs._M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&relative_home_path,"/usr/local/share:/usr/share",&local_1b1);
      CopyIncludedPaths(SUB81(&relative_home_path,0),&relative_path,&search_path,output_path);
      std::__cxx11::string::~string((string *)&relative_home_path);
    }
    else {
      CopyIncludedPaths(SUB81(&xdg_data_dirs,0),&relative_path,&search_path,output_path);
    }
    if (xdg_data_home._M_string_length == 0) {
      if (home._M_string_length != 0) {
        std::__cxx11::string::string((string *)&relative_home_path,home_additional,&local_1b1);
        std::__cxx11::string::append((string *)&relative_home_path);
        CopyIncludedPaths(SUB81(&home,0),&relative_home_path,&search_path,output_path);
        std::__cxx11::string::~string((string *)&relative_home_path);
      }
    }
    else {
      CopyIncludedPaths(SUB81(&xdg_data_home,0),&relative_path,&search_path,output_path);
    }
    std::__cxx11::string::~string((string *)&home);
    std::__cxx11::string::~string((string *)&xdg_data_home);
    std::__cxx11::string::~string((string *)&xdg_data_dirs);
  }
  else {
    std::__cxx11::string::string((string *)&xdg_conf_dirs,"",(allocator *)&xdg_data_dirs);
    CopyIncludedPaths(SUB81(&override_path,0),&xdg_conf_dirs,&search_path,output_path);
  }
  std::__cxx11::string::~string((string *)&xdg_conf_dirs);
  uVar9 = 0;
  cVar8 = (char)&search_path;
  uVar6 = std::__cxx11::string::find(cVar8,0x3a);
  xdg_conf_dirs._M_dataplus._M_p = (pointer)&xdg_conf_dirs.field_2;
  xdg_conf_dirs._M_string_length = 0;
  xdg_conf_dirs.field_2._M_local_buf[0] = '\0';
  while (uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&xdg_data_dirs,(ulong)&search_path);
    std::__cxx11::string::operator=((string *)&xdg_conf_dirs,(string *)&xdg_data_dirs);
    std::__cxx11::string::~string((string *)&xdg_data_dirs);
    CheckAllFilesInThePath(&xdg_conf_dirs,SUB81(&filenames,0),manifest_files_00);
    uVar9 = uVar6;
    while (uVar6 == uVar9) {
      uVar9 = uVar6 + 1;
      uVar6 = std::__cxx11::string::find(cVar8,0x3a);
    }
  }
  if (uVar9 < search_path._M_string_length) {
    std::__cxx11::string::substr((ulong)&xdg_data_dirs,(ulong)&search_path);
    std::__cxx11::string::operator=((string *)&xdg_conf_dirs,(string *)&xdg_data_dirs);
    std::__cxx11::string::~string((string *)&xdg_data_dirs);
    CheckAllFilesInThePath(&xdg_conf_dirs,SUB81(&filenames,0),manifest_files_01);
  }
  std::__cxx11::string::~string((string *)&xdg_conf_dirs);
  std::__cxx11::string::~string((string *)&search_path);
  std::__cxx11::string::~string((string *)&override_path);
  pbVar1 = filenames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (filename = filenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; filename != pbVar1;
      filename = filename + 1) {
    CreateIfValid(type,filename,manifest_files);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  XVar7 = XR_SUCCESS;
LAB_0011443a:
  std::__cxx11::string::~string((string *)&registry_location);
  std::__cxx11::string::~string((string *)&override_env_var);
  std::__cxx11::string::~string((string *)&relative_path);
  return XVar7;
}

Assistant:

XrResult ApiLayerManifestFile::FindManifestFiles(const std::string &openxr_command, ManifestFileType type,
                                                 std::vector<std::unique_ptr<ApiLayerManifestFile>> &manifest_files) {
    std::string relative_path;
    std::string override_env_var;
    std::string registry_location;

    // Add the appropriate top-level folders for the relative path.  These should be
    // the string "openxr/" followed by the API major version as a string.
    relative_path = OPENXR_RELATIVE_PATH;
    relative_path += std::to_string(XR_VERSION_MAJOR(XR_CURRENT_API_VERSION));

    switch (type) {
        case MANIFEST_TYPE_IMPLICIT_API_LAYER:
            relative_path += OPENXR_IMPLICIT_API_LAYER_RELATIVE_PATH;
            override_env_var = "";
#ifdef XR_OS_WINDOWS
            registry_location = OPENXR_IMPLICIT_API_LAYER_REGISTRY_LOCATION;
#endif
            break;
        case MANIFEST_TYPE_EXPLICIT_API_LAYER:
            relative_path += OPENXR_EXPLICIT_API_LAYER_RELATIVE_PATH;
            override_env_var = OPENXR_API_LAYER_PATH_ENV_VAR;
#ifdef XR_OS_WINDOWS
            registry_location = OPENXR_EXPLICIT_API_LAYER_REGISTRY_LOCATION;
#endif
            break;
        default:
            LoaderLogger::LogErrorMessage(openxr_command,
                                          "ApiLayerManifestFile::FindManifestFiles - unknown manifest file requested");
            return XR_ERROR_FILE_ACCESS_ERROR;
    }

    bool override_active = false;
    std::vector<std::string> filenames;
    ReadDataFilesInSearchPaths(override_env_var, relative_path, override_active, filenames);

#ifdef XR_OS_WINDOWS
    // Read the registry if the override wasn't active.
    if (!override_active) {
        ReadLayerDataFilesInRegistry(registry_location, filenames);
    }
#endif

    for (std::string &cur_file : filenames) {
        ApiLayerManifestFile::CreateIfValid(type, cur_file, manifest_files);
    }

#if defined(XR_KHR_LOADER_INIT_SUPPORT) && defined(XR_USE_PLATFORM_ANDROID)
    ApiLayerManifestFile::AddManifestFilesAndroid(openxr_command, type, manifest_files);
#endif  // defined(XR_USE_PLATFORM_ANDROID) && defined(XR_KHR_LOADER_INIT_SUPPORT)

    return XR_SUCCESS;
}